

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O3

IWindowPtr __thiscall cursespp::LayoutBase::FocusNext(LayoutBase *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar1;
  long *plVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long *in_RSI;
  signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *this_01;
  IWindowPtr IVar5;
  undefined1 auStack_48 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  (**(code **)(*in_RSI + 0x1d0))(&local_38);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  plVar2 = local_38;
  if (local_38 != (long *)0x0) {
    do {
      if ((plVar2 != (long *)0x0) &&
         (plVar1 = (long *)__dynamic_cast(plVar2,&IWindow::typeinfo,&typeinfo,0),
         plVar1 != (long *)0x0)) {
        (**(code **)(*plVar1 + 0x1c0))(this,plVar1);
        _Var4._M_pi = extraout_RDX;
        if ((this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable !=
            (_func_int **)0x0) goto LAB_0016d2be;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      plVar2 = (long *)(**(code **)(*plVar2 + 0x128))(plVar2);
    } while (plVar2 != in_RSI);
  }
  if (*(int *)((long)in_RSI + 0x1fc) != 1 || (int)in_RSI[0x3f] != -2) {
    iVar3 = (int)in_RSI[0x3f] + 1;
    *(int *)(in_RSI + 0x3f) = iVar3;
    if (iVar3 < (int)((ulong)(in_RSI[0x3d] - in_RSI[0x3c]) >> 4)) {
      this_01 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0;
      goto LAB_0016d27f;
    }
    if (*(int *)((long)in_RSI + 0x1fc) == 0) {
      *(undefined4 *)(in_RSI + 0x3f) = 0;
      this_01 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)
                (in_RSI + 0x30);
      goto LAB_0016d27f;
    }
    *(undefined4 *)(in_RSI + 0x3f) = 0xfffffffe;
  }
  this_01 = (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)
            (in_RSI + 0x27);
LAB_0016d27f:
  (**(code **)(*in_RSI + 600))(auStack_48);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (this_01 != (signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local> *)0x0
     ) {
    sigslot::signal1<cursespp::LayoutBase::FocusDirection,_sigslot::multi_threaded_local>::
    operator()(this_01,FocusForward);
  }
  (**(code **)(*in_RSI + 0x1d0))(this);
  _Var4._M_pi = extraout_RDX_00;
LAB_0016d2be:
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IWindowPtr)IVar5.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IWindowPtr LayoutBase::FocusNext() {
    sigslot::signal1<FocusDirection>* notify = nullptr;

    /* GetFocus() will return the focused Window recursively. once we know
    what it is, see if it can focus next. if it cannot, see if its parent
    can, and so on, until we reach ourselves. reaching ourself is the base
    case, and we drop through to the actual focus logic below.

    NOTE: IF YOU UPDATE THIS LOGIC, ALSO UPDATE THE CORRESPONDING CODE IN
    LayoutBase::FocusPrev() */
    auto currFocus = this->GetFocus().get();
    if (currFocus) {
        do {
            auto asLayout = dynamic_cast<LayoutBase*>(currFocus);
            if (asLayout) {
                auto nextFocus = asLayout->FocusNext();
                if (nextFocus) {
                    if (notify) {
                        (*notify)(FocusForward);
                    }
                    return nextFocus;
                }
            }

            Window* parent = (Window*) currFocus->GetParent();
            if (parent == this) { /* base case / stop condition. this should always be hit */
                break;
            }
            currFocus = parent;
        } while (true);
    }

    /*** actual focus logic starts here ***/

    if (this->focused == NO_FOCUS && this->focusMode == FocusModeTerminating) {
        /* nothing. we're already terminated. */
        notify = &FocusTerminated;
    }
    else {
        ++this->focused;
        if (this->focused >= (int) this->focusable.size()) {
            if (this->focusMode == FocusModeCircular) {
                this->focused = 0;
                notify = &FocusWrapped;
            }
            else {
                this->focused = NO_FOCUS;
                notify = &FocusTerminated;
            }
        }
    }

    this->EnsureValidFocusFromNext();

    if (notify) {
        (*notify)(FocusForward);
    }

    return this->GetFocus();
}